

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::tracker_scrape_response
          (torrent *this,tracker_request *req,int complete,int incomplete,int downloaded,int param_5
          )

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  announce_entry *this_00;
  announce_endpoint *paVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  protocol_version hash_version;
  endpoint local_endpoint;
  protocol_version local_71;
  int local_70;
  int local_6c;
  data_union local_68;
  
  local_70 = incomplete;
  local_6c = complete;
  bVar3 = digest32<160L>::operator==(&req->info_hash,&(this->m_info_hash).v1);
  bVar3 = !bVar3;
  local_71 = bVar3;
  this_00 = tracker_list::find_tracker(&this->m_trackers,&req->url);
  local_68.v6.sin6_scope_id = 0;
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  local_68._16_4_ = 0;
  local_68._20_4_ = 0;
  local_68._0_8_ = 2;
  if (this_00 != (announce_entry *)0x0) {
    paVar5 = announce_entry::find_endpoint(this_00,&req->outgoing_socket);
    if (paVar5 != (announce_endpoint *)0x0) {
      local_68._0_8_ = *(undefined8 *)&(paVar5->local_endpoint).impl_.data_;
      uVar1 = *(undefined8 *)((long)&(paVar5->local_endpoint).impl_.data_ + 8);
      uVar2 = *(undefined8 *)((long)&(paVar5->local_endpoint).impl_.data_ + 0x14);
      local_68._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar5->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_68._20_4_ = (undefined4)uVar2;
      local_68.v6.sin6_scope_id = (uint32_t)((ulong)uVar2 >> 0x20);
      local_68._8_4_ = (undefined4)uVar1;
      local_68._12_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      if (-1 < incomplete) {
        (paVar5->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[bVar3].
        scrape_incomplete = incomplete;
      }
      if (-1 < complete) {
        (paVar5->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[bVar3].
        scrape_complete = complete;
      }
      if (-1 < downloaded) {
        (paVar5->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[bVar3].
        scrape_downloaded = downloaded;
      }
      update_scrape_state(this);
    }
  }
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if (((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x68) & 0x10) != 0) ||
     (req->triggered_manually == true)) {
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc0);
    alert_manager::
    emplace_alert<libtorrent::scrape_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar4),
               (torrent_handle *)&stack0xffffffffffffffc0,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_68.base,&local_70,&local_6c,&req->url,
               &local_71);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void torrent::tracker_scrape_response(tracker_request const& req
		, int const complete, int const incomplete, int const downloaded, int /* downloaders */)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(req.kind & tracker_request::scrape_request);

		protocol_version const hash_version = req.info_hash == m_info_hash.v1
			? protocol_version::V1 : protocol_version::V2;

		aux::announce_entry* ae = m_trackers.find_tracker(req.url);
		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(req.outgoing_socket);
			if (aep)
			{
				local_endpoint = aep->local_endpoint;
				if (incomplete >= 0) aep->info_hashes[hash_version].scrape_incomplete = incomplete;
				if (complete >= 0) aep->info_hashes[hash_version].scrape_complete = complete;
				if (downloaded >= 0) aep->info_hashes[hash_version].scrape_downloaded = downloaded;

				update_scrape_state();
			}
		}

		// if this was triggered manually we need to post this unconditionally,
		// since the client expects a response from its action, regardless of
		// whether all tracker events have been enabled by the alert mask
		if (m_ses.alerts().should_post<scrape_reply_alert>()
			|| req.triggered_manually)
		{
			m_ses.alerts().emplace_alert<scrape_reply_alert>(
				get_handle(), local_endpoint, incomplete, complete, req.url, hash_version);
		}
	}